

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_dec_api.c
# Opt level: O0

MPP_RET dummy_dec_deinit(void *dec)

{
  DummyDec *p;
  void *dec_local;
  
  if (dec == (void *)0x0) {
    _mpp_log_l(2,"dummy_dec_api","found NULL intput\n","dummy_dec_deinit");
    dec_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    if (*(long *)((long)dec + 0x28) != 0) {
      mpp_packet_deinit((MppPacket *)((long)dec + 0x28));
    }
    if (*(long *)((long)dec + 0x18) != 0) {
      mpp_osal_free("dummy_dec_deinit",*(void **)((long)dec + 0x18));
    }
    dec_local._4_4_ = MPP_OK;
  }
  return dec_local._4_4_;
}

Assistant:

MPP_RET dummy_dec_deinit(void *dec)
{
    DummyDec *p;
    if (NULL == dec) {
        mpp_err_f("found NULL intput\n");
        return MPP_ERR_NULL_PTR;
    }

    p = (DummyDec *)dec;
    if (p->task_pkt)
        mpp_packet_deinit(&p->task_pkt);
    if (p->stream)
        mpp_free(p->stream);
    return MPP_OK;
}